

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* testing::internal::ActionResultHolder<std::__cxx11::string>::
  PerformDefaultAction<std::__cxx11::string(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
            (FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
             *func_mocker,ArgumentTuple *args,string *call_description)

{
  ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Result local_68;
  char local_38 [8];
  undefined8 uStack_30;
  
  pAVar1 = (ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)operator_new(0x28);
  FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::PerformDefaultAction(&local_68,func_mocker,args,call_description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    uStack_30 = local_68.field_2._8_8_;
    local_68._M_dataplus._M_p = local_38;
  }
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_002db080;
  paVar2 = &(pAVar1->result_).value_.field_2;
  (pAVar1->result_).value_._M_dataplus._M_p = (pointer)paVar2;
  if (local_68._M_dataplus._M_p == local_38) {
    paVar2->_M_allocated_capacity = local_68.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(pAVar1->result_).value_.field_2 + 8) = uStack_30;
  }
  else {
    (pAVar1->result_).value_._M_dataplus._M_p = local_68._M_dataplus._M_p;
    (pAVar1->result_).value_.field_2._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
  }
  (pAVar1->result_).value_._M_string_length = local_68._M_string_length;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }